

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSNode.h
# Opt level: O2

char * dg::pta::PSNodeTypeToCString(PSNodeType type)

{
  if (type - ALLOC < 0x17) {
    return &DAT_0011b1a4 + *(int *)(&DAT_0011b1a4 + (ulong)(type - ALLOC) * 4);
  }
  return "Unknown type";
}

Assistant:

inline const char *PSNodeTypeToCString(enum PSNodeType type) {
#define ELEM(t)                                                                \
    case t:                                                                    \
        do {                                                                   \
            return (#t);                                                       \
        } while (0);                                                           \
        break;
    switch (type) {
        ELEM(PSNodeType::ALLOC)
        ELEM(PSNodeType::LOAD)
        ELEM(PSNodeType::STORE)
        ELEM(PSNodeType::GEP)
        ELEM(PSNodeType::PHI)
        ELEM(PSNodeType::CAST)
        ELEM(PSNodeType::FUNCTION)
        ELEM(PSNodeType::CALL)
        ELEM(PSNodeType::CALL_FUNCPTR)
        ELEM(PSNodeType::CALL_RETURN)
        ELEM(PSNodeType::FORK)
        ELEM(PSNodeType::JOIN)
        ELEM(PSNodeType::ENTRY)
        ELEM(PSNodeType::RETURN)
        ELEM(PSNodeType::CONSTANT)
        ELEM(PSNodeType::NOOP)
        ELEM(PSNodeType::MEMCPY)
        ELEM(PSNodeType::NULL_ADDR)
        ELEM(PSNodeType::UNKNOWN_MEM)
        ELEM(PSNodeType::FREE)
        ELEM(PSNodeType::INVALIDATE_OBJECT)
        ELEM(PSNodeType::INVALIDATE_LOCALS)
        ELEM(PSNodeType::INVALIDATED)
    default:
        assert(0 && "unknown PointerGraph type");
        return "Unknown type";
    };
#undef ELEM
}